

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O3

void nni_aio_stop(nni_aio *aio)

{
  nni_aio_expire_q *mtx;
  nni_aio_cancel_fn p_Var1;
  void *pvVar2;
  
  if ((aio != (nni_aio *)0x0) && (aio->a_init == true)) {
    mtx = aio->a_expire_q;
    nni_mtx_lock(&mtx->eq_mtx);
    aio->a_stop = true;
    if (aio->a_expiring == true) {
      do {
        nni_cv_wait(&mtx->eq_cv);
      } while (aio->a_expiring != false);
    }
    nni_list_node_remove(&aio->a_expire_node);
    p_Var1 = aio->a_cancel_fn;
    pvVar2 = aio->a_cancel_arg;
    aio->a_cancel_fn = (nni_aio_cancel_fn)0x0;
    aio->a_cancel_arg = (void *)0x0;
    nni_mtx_unlock(&mtx->eq_mtx);
    if (p_Var1 != (nni_aio_cancel_fn)0x0) {
      (*p_Var1)(aio,pvVar2,999);
    }
    if (aio->a_expire_q != (nni_aio_expire_q *)0x0) {
      nni_task_wait(&aio->a_task);
      return;
    }
  }
  return;
}

Assistant:

void
nni_aio_stop(nni_aio *aio)
{
	if (aio != NULL && aio->a_init) {
		nni_aio_cancel_fn fn;
		void             *arg;
		nni_aio_expire_q *eq = aio->a_expire_q;

		nni_mtx_lock(&eq->eq_mtx);
		aio->a_stop = true;
		while (aio->a_expiring) {
			nni_cv_wait(&eq->eq_cv);
		}
		nni_aio_expire_rm(aio);
		fn                = aio->a_cancel_fn;
		arg               = aio->a_cancel_arg;
		aio->a_cancel_fn  = NULL;
		aio->a_cancel_arg = NULL;
		nni_mtx_unlock(&eq->eq_mtx);

		if (fn != NULL) {
			fn(aio, arg, NNG_ESTOPPED);
		}

		nni_aio_wait(aio);
	}
}